

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_pivot.cpp
# Opt level: O1

unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> __thiscall
duckdb::Binder::BindBoundPivot(Binder *this,PivotRef *ref)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Head_base<0UL,_duckdb::BoundTableRef_*,_false> _Var2;
  __buckets_ptr pp_Var3;
  pointer pcVar4;
  element_type *peVar5;
  long lVar6;
  long lVar7;
  _Head_base<0UL,_duckdb::BoundPivotRef_*,_false> _Var8;
  undefined8 uVar9;
  undefined8 uVar10;
  __uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_> _Var11;
  idx_t iVar12;
  pointer pBVar13;
  Binder *pBVar14;
  type node;
  reference pvVar15;
  reference __x;
  long *plVar16;
  pointer pEVar17;
  type other;
  InternalException *this_02;
  ulong *puVar18;
  long in_RDX;
  size_type __n;
  pointer *__ptr;
  element_type *this_03;
  size_type __n_00;
  templated_unique_single_t result;
  string subquery_alias;
  string pivot_str;
  vector<duckdb::LogicalType,_true> types;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  names;
  vector<duckdb::LogicalType,_true> child_types;
  string str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  child_names;
  _Head_base<0UL,_duckdb::BoundPivotRef_*,_false> local_178;
  long local_170;
  undefined1 local_168 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  pointer local_128;
  optional_ptr<duckdb::Binder,_true> local_120;
  __uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_> local_118;
  reference local_110;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  size_t local_b8;
  Binder *local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_a0;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_98;
  Binder *local_90;
  undefined1 local_88 [32];
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_48;
  
  local_118._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
  super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl =
       (tuple<duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>)
       (tuple<duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>)this;
  local_178._M_head_impl = (BoundPivotRef *)operator_new(0x88);
  ((local_178._M_head_impl)->super_BoundTableRef).type = PIVOT;
  ((local_178._M_head_impl)->super_BoundTableRef).sample.
  super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
  super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
  super__Head_base<0UL,_duckdb::SampleOptions_*,_false> =
       (_Head_base<0UL,_duckdb::SampleOptions_*,_false>)0x0;
  ((local_178._M_head_impl)->super_BoundTableRef)._vptr_BoundTableRef =
       (_func_int **)&PTR__BoundPivotRef_019ad078;
  ((local_178._M_head_impl)->bound_pivot).types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_178._M_head_impl)->bound_pivot).types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_178._M_head_impl)->bound_pivot).types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_178._M_head_impl)->bound_pivot).pivot_values.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_178._M_head_impl)->bound_pivot).pivot_values.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_178._M_head_impl)->bound_pivot).pivot_values.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_178._M_head_impl)->bound_pivot).aggregates.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_178._M_head_impl)->bound_pivot).aggregates.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_178._M_head_impl)->bound_pivot).aggregates.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_178._M_head_impl)->child_binder).internal.
  super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  ((local_178._M_head_impl)->child_binder).internal.
  super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ((local_178._M_head_impl)->child).
  super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
  super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
  super__Head_base<0UL,_duckdb::BoundTableRef_*,_false> =
       (_Head_base<0UL,_duckdb::BoundTableRef_*,_false>)0x0;
  local_120.ptr = (Binder *)ref;
  iVar12 = GenerateTableIndex((Binder *)ref);
  pBVar13 = unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>::
            operator->((unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>
                        *)&local_178);
  pBVar13->bind_index = iVar12;
  CreateBinder((Binder *)local_168,(local_120.ptr)->context,local_120,REGULAR_BINDER);
  pBVar13 = unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>::
            operator->((unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>
                        *)&local_178);
  uVar10 = local_168._8_8_;
  uVar9 = local_168._0_8_;
  local_168._0_8_ = (element_type *)0x0;
  local_168._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_01 = (pBVar13->child_binder).internal.
            super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pBVar13->child_binder).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)uVar9;
  (pBVar13->child_binder).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar10;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
  }
  pBVar13 = unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>::
            operator->((unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>
                        *)&local_178);
  pBVar14 = shared_ptr<duckdb::Binder,_true>::operator->(&pBVar13->child_binder);
  unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator*
            ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
             (in_RDX + 0x68));
  Bind((Binder *)local_168,(TableRef *)pBVar14);
  pBVar13 = unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>::
            operator->((unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>
                        *)&local_178);
  uVar9 = local_168._0_8_;
  local_168._0_8_ = (element_type *)0x0;
  _Var2._M_head_impl =
       (pBVar13->child).
       super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
       super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
       super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl;
  (pBVar13->child).
  super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
  super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
  super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl = (BoundTableRef *)uVar9;
  if (_Var2._M_head_impl != (BoundTableRef *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_BoundTableRef + 8))();
  }
  if ((element_type *)local_168._0_8_ != (element_type *)0x0) {
    (**(code **)(*(long *)local_168._0_8_ + 8))();
  }
  local_128 = unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>::
              operator->((unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>
                          *)&local_178);
  pBVar13 = unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>::
            operator->((unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>
                        *)&local_178);
  node = unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::
         operator*(&pBVar13->child);
  local_98 = &(local_128->bound_pivot).aggregates;
  ExtractPivotAggregates(node,local_98);
  local_170 = in_RDX;
  if ((long)(local_128->bound_pivot).aggregates.
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(local_128->bound_pivot).aggregates.
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 3 ==
      *(long *)(in_RDX + 0x110) - *(long *)(in_RDX + 0x108) >> 5) {
    local_48.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b8 = 0;
    local_c8._M_allocated_capacity = 0;
    local_c8._8_8_ = 0;
    pBVar13 = unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>::
              operator->((unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>
                          *)&local_178);
    pBVar14 = shared_ptr<duckdb::Binder,_true>::operator->(&pBVar13->child_binder);
    BindContext::GetTypesAndNames
              (&pBVar14->bind_context,&local_48,(vector<duckdb::LogicalType,_true> *)&local_c8);
    local_e8.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_108.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_108.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (*(long *)(in_RDX + 0xf8) != *(long *)(in_RDX + 0xf0)) {
      this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 *)(local_170 + 0xf0);
      __n_00 = 0;
      do {
        pvVar15 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[](this_00,__n_00);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_e8,pvVar15);
        __x = vector<duckdb::LogicalType,_true>::operator[]
                        ((vector<duckdb::LogicalType,_true> *)&local_c8,__n_00);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  (&local_108,__x);
        __n_00 = __n_00 + 1;
      } while (__n_00 < (ulong)(*(long *)(local_170 + 0xf8) - *(long *)(local_170 + 0xf0) >> 5));
    }
    pBVar14 = *(Binder **)(local_170 + 0xd8);
    local_a8 = *(Binder **)(local_170 + 0xe0);
    if (pBVar14 != local_a8) {
      local_a0 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)(local_170 + 0x108);
      paVar1 = &local_68.field_2;
      do {
        if (*(long *)(local_170 + 0x110) != *(long *)(local_170 + 0x108)) {
          __n = 0;
          local_90 = pBVar14;
          do {
            local_110 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                        ::operator[](local_98,__n);
            pvVar15 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      ::operator[](local_a0,__n);
            local_168._0_8_ = local_168 + 0x10;
            pp_Var3 = (pBVar14->CTE_bindings)._M_h._M_buckets;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)local_168,pp_Var3,
                       (pBVar14->CTE_bindings)._M_h._M_bucket_count + (long)pp_Var3);
            if ((8 < (ulong)((long)(local_128->bound_pivot).aggregates.
                                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                   .
                                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(local_128->bound_pivot).aggregates.
                                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                  .
                                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)) ||
               (pvVar15->_M_string_length != 0)) {
              if (pvVar15->_M_string_length == 0) {
                pEVar17 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          ::operator->(local_110);
                (*(pEVar17->super_BaseExpression)._vptr_BaseExpression[7])(&local_68);
              }
              else {
                pcVar4 = (pvVar15->_M_dataplus)._M_p;
                local_68._M_dataplus._M_p = (pointer)paVar1;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_68,pcVar4,pcVar4 + pvVar15->_M_string_length);
              }
              plVar16 = (long *)::std::__cxx11::string::replace
                                          ((ulong)&local_68,0,(char *)0x0,0x13b0a08);
              local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
              puVar18 = (ulong *)(plVar16 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar16 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar18) {
                local_148.field_2._M_allocated_capacity = *puVar18;
                local_148.field_2._8_8_ = plVar16[3];
              }
              else {
                local_148.field_2._M_allocated_capacity = *puVar18;
                local_148._M_dataplus._M_p = (pointer)*plVar16;
              }
              local_148._M_string_length = plVar16[1];
              *plVar16 = (long)puVar18;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              ::std::__cxx11::string::_M_append(local_168,(ulong)local_148._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148._M_dataplus._M_p != &local_148.field_2) {
                operator_delete(local_148._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_68._M_dataplus._M_p != paVar1) {
                operator_delete(local_68._M_dataplus._M_p);
              }
            }
            local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
            local_148._M_string_length = 0;
            local_148.field_2._M_allocated_capacity =
                 local_148.field_2._M_allocated_capacity & 0xffffffffffffff00;
            peVar5 = (element_type *)
                     (pBVar14->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                     super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
            for (this_03 = (pBVar14->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.
                           internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr; this_03 != peVar5;
                this_03 = (element_type *)
                          &(this_03->CTE_bindings)._M_h._M_rehash_policy._M_next_resize) {
              Value::ToString_abi_cxx11_(&local_68,(Value *)this_03);
              if ((_Hash_node_base *)local_148._M_string_length == (_Hash_node_base *)0x0) {
                ::std::__cxx11::string::operator=((string *)&local_148,(string *)&local_68);
              }
              else {
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_88,"_",&local_68);
                ::std::__cxx11::string::_M_append((char *)&local_148,local_88._0_8_);
                if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
                  operator_delete((void *)local_88._0_8_);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_68._M_dataplus._M_p != paVar1) {
                operator_delete(local_68._M_dataplus._M_p);
              }
            }
            pBVar13 = unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>
                      ::operator->((unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>
                                    *)&local_178);
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &(pBVar13->bound_pivot).pivot_values,&local_148);
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_168);
            pEVar17 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      ::operator->(local_110);
            ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                      (&local_108,&pEVar17->return_type);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p);
            }
            pBVar14 = local_90;
            if ((element_type *)local_168._0_8_ != (element_type *)(local_168 + 0x10)) {
              operator_delete((void *)local_168._0_8_);
            }
            __n = __n + 1;
          } while (__n < (ulong)(*(long *)(local_170 + 0x110) - *(long *)(local_170 + 0x108) >> 5));
        }
        pBVar14 = (Binder *)&(pBVar14->CTE_bindings)._M_h._M_rehash_policy;
      } while (pBVar14 != local_a8);
    }
    lVar6 = *(long *)(local_170 + 0xf0);
    lVar7 = *(long *)(local_170 + 0xf8);
    pBVar13 = unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>::
              operator->((unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>
                          *)&local_178);
    (pBVar13->bound_pivot).group_count = lVar7 - lVar6 >> 5;
    pBVar13 = unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>::
              operator->((unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>
                          *)&local_178);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
              (&(pBVar13->bound_pivot).types.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,&local_108);
    local_168._0_8_ = local_168 + 0x10;
    if (*(long *)(local_170 + 0x18) == 0) {
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"__unnamed_pivot","");
    }
    else {
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_168,*(long *)(local_170 + 0x10),
                 *(long *)(local_170 + 0x18) + *(long *)(local_170 + 0x10));
    }
    _Var11._M_t.
    super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
    super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl =
         local_118._M_t.
         super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>
         .super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl;
    QueryResult::DeduplicateColumns(&local_e8);
    pBVar13 = unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>::
              operator->((unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>
                          *)&local_178);
    BindContext::AddGenericBinding
              (&(local_120.ptr)->bind_context,pBVar13->bind_index,(string *)local_168,&local_e8,
               (vector<duckdb::LogicalType,_true> *)&local_108);
    pBVar13 = unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>::
              operator->((unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>
                          *)&local_178);
    other = shared_ptr<duckdb::Binder,_true>::operator*(&pBVar13->child_binder);
    MoveCorrelatedExpressions(local_120.ptr,other);
    _Var8._M_head_impl = local_178._M_head_impl;
    local_178._M_head_impl = (BoundPivotRef *)0x0;
    *(BoundPivotRef **)
     _Var11._M_t.
     super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
     super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl = _Var8._M_head_impl;
    if ((element_type *)local_168._0_8_ != (element_type *)(local_168 + 0x10)) {
      operator_delete((void *)local_168._0_8_);
    }
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_108);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_e8);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_c8);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_48);
    if (local_178._M_head_impl != (BoundPivotRef *)0x0) {
      (*((local_178._M_head_impl)->super_BoundTableRef)._vptr_BoundTableRef[1])();
    }
    return (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)
           (_Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>)
           _Var11._M_t.
           super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>
           .super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl;
  }
  this_02 = (InternalException *)__cxa_allocate_exception(0x10);
  local_168._0_8_ = local_168 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_168,"Pivot aggregate count mismatch (expected %llu, found %llu)","");
  InternalException::InternalException<unsigned_long,unsigned_long>
            (this_02,(string *)local_168,
             *(long *)(local_170 + 0x110) - *(long *)(local_170 + 0x108) >> 5,
             (long)(local_128->bound_pivot).aggregates.
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(local_128->bound_pivot).aggregates.
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<BoundTableRef> Binder::BindBoundPivot(PivotRef &ref) {
	// bind the child table in a child binder
	auto result = make_uniq<BoundPivotRef>();
	result->bind_index = GenerateTableIndex();
	result->child_binder = Binder::CreateBinder(context, this);
	result->child = result->child_binder->Bind(*ref.source);

	auto &aggregates = result->bound_pivot.aggregates;
	ExtractPivotAggregates(*result->child, aggregates);
	if (aggregates.size() != ref.bound_aggregate_names.size()) {
		throw InternalException("Pivot aggregate count mismatch (expected %llu, found %llu)",
		                        ref.bound_aggregate_names.size(), aggregates.size());
	}

	vector<string> child_names;
	vector<LogicalType> child_types;
	result->child_binder->bind_context.GetTypesAndNames(child_names, child_types);

	vector<string> names;
	vector<LogicalType> types;
	// emit the groups
	for (idx_t i = 0; i < ref.bound_group_names.size(); i++) {
		names.push_back(ref.bound_group_names[i]);
		types.push_back(child_types[i]);
	}
	// emit the pivot columns
	for (auto &pivot_value : ref.bound_pivot_values) {
		for (idx_t aggr_idx = 0; aggr_idx < ref.bound_aggregate_names.size(); aggr_idx++) {
			auto &aggr = aggregates[aggr_idx];
			auto &aggr_name = ref.bound_aggregate_names[aggr_idx];
			auto name = pivot_value.name;
			if (aggregates.size() > 1 || !aggr_name.empty()) {
				// if there are multiple aggregates specified we add the name of the aggregate as well
				name += "_" + (aggr_name.empty() ? aggr->GetName() : aggr_name);
			}
			string pivot_str;
			for (auto &value : pivot_value.values) {
				auto str = value.ToString();
				if (pivot_str.empty()) {
					pivot_str = std::move(str);
				} else {
					pivot_str += "_" + str;
				}
			}
			result->bound_pivot.pivot_values.push_back(std::move(pivot_str));
			names.push_back(std::move(name));
			types.push_back(aggr->return_type);
		}
	}
	result->bound_pivot.group_count = ref.bound_group_names.size();
	result->bound_pivot.types = types;
	auto subquery_alias = ref.alias.empty() ? "__unnamed_pivot" : ref.alias;
	QueryResult::DeduplicateColumns(names);
	bind_context.AddGenericBinding(result->bind_index, subquery_alias, names, types);

	MoveCorrelatedExpressions(*result->child_binder);
	return std::move(result);
}